

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O1

int Test_N_VGetVectorID(N_Vector X,N_Vector_ID ID,int myid)

{
  N_Vector_ID NVar1;
  uint uVar2;
  int iVar3;
  
  NVar1 = N_VGetVectorID();
  if (NVar1 == ID) {
    iVar3 = 0;
    if (myid == 0) {
      puts("PASSED test -- N_VGetVectorID ");
      iVar3 = 0;
    }
  }
  else {
    printf(">>> FAILED test -- N_VGetVectorID, Proc %d \n",(ulong)(uint)myid);
    uVar2 = N_VGetVectorID(X);
    printf("    Unrecognized vector type %d \n \n",(ulong)uVar2);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int Test_N_VGetVectorID(N_Vector X, N_Vector_ID ID, int myid)
{
  if (N_VGetVectorID(X) != ID)
  {
    printf(">>> FAILED test -- N_VGetVectorID, Proc %d \n", myid);
    printf("    Unrecognized vector type %d \n \n", N_VGetVectorID(X));
    return (1);
  }
  else if (myid == 0) { printf("PASSED test -- N_VGetVectorID \n"); }
  return (0);
}